

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O1

Fields * trieste::wf::ops::operator*(Fields *__return_storage_ptr__,Field *fst,Field *snd)

{
  void *p;
  long lVar1;
  initializer_list<trieste::wf::Field> __l;
  long alStack_78 [2];
  allocator_type local_61;
  Field local_60;
  TokenDef *local_40;
  vector<trieste::Token,_std::allocator<trieste::Token>_> local_38;
  
  local_60.name.def = (fst->name).def;
  alStack_78[1] = 0x14dee9;
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_60.choice.types,&(fst->choice).types);
  local_40 = (snd->name).def;
  alStack_78[1] = 0x14df05;
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_38,&(snd->choice).types);
  alStack_78[1] = 0x14df1c;
  __l._M_len = 2;
  __l._M_array = &local_60;
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&__return_storage_ptr__->fields,__l,&local_61);
  (__return_storage_ptr__->binding).def = (TokenDef *)Invalid;
  lVar1 = 0x40;
  do {
    p = *(void **)((long)alStack_78 + lVar1);
    if (p != (void *)0x0) {
      alStack_78[1] = 0x14df43;
      operator_delete(p,*(long *)(&stack0xffffffffffffff98 + lVar1) - (long)p);
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

inline Fields operator*(Field&& fst, const Field& snd)
      {
        return Fields{std::vector<Field>{fst, snd}, Invalid};
      }